

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

void Curl_wildcard_dtor(WildcardData *wc)

{
  if (wc != (WildcardData *)0x0) {
    if (wc->tmp_dtor != (curl_wildcard_tmp_dtor)0x0) {
      (*wc->tmp_dtor)(wc->tmp);
      wc->tmp = (void *)0x0;
      wc->tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
    }
    if (wc->filelist != (curl_llist *)0x0) {
      Curl_llist_destroy(wc->filelist,(void *)0x0);
      wc->filelist = (curl_llist *)0x0;
    }
    (*Curl_cfree)(wc->path);
    wc->path = (char *)0x0;
    (*Curl_cfree)(wc->pattern);
    wc->pattern = (char *)0x0;
    wc->customptr = (void *)0x0;
    wc->state = CURLWC_INIT;
  }
  return;
}

Assistant:

void Curl_wildcard_dtor(struct WildcardData *wc)
{
  if(!wc)
    return;

  if(wc->tmp_dtor) {
    wc->tmp_dtor(wc->tmp);
    wc->tmp_dtor = ZERO_NULL;
    wc->tmp = NULL;
  }
  DEBUGASSERT(wc->tmp == NULL);

  if(wc->filelist) {
    Curl_llist_destroy(wc->filelist, NULL);
    wc->filelist = NULL;
  }

  free(wc->path);
  wc->path = NULL;
  free(wc->pattern);
  wc->pattern = NULL;

  wc->customptr = NULL;
  wc->state = CURLWC_INIT;
}